

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void Json::appendHex(String *result,uint ch)

{
  undefined1 auVar1 [12];
  String local_38;
  uint local_14;
  String *pSStack_10;
  uint ch_local;
  String *result_local;
  
  local_14 = ch;
  pSStack_10 = result;
  auVar1 = std::__cxx11::string::append((char *)result);
  toHex16Bit_abi_cxx11_(&local_38,(Json *)(ulong)local_14,auVar1._8_4_);
  std::__cxx11::string::append(auVar1._0_8_);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void appendHex(String& result, unsigned ch) {
  result.append("\\u").append(toHex16Bit(ch));
}